

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O2

bool __thiscall TRM::TGAImage::set(TGAImage *this,int x,int y,TGAColor *c)

{
  if (((-1 < (y | x) && this->data != (uchar *)0x0) && (x < this->width)) && (y < this->height)) {
    memcpy(this->data + (long)(this->width * y + x) * (long)this->bytespp,c,(long)this->bytespp);
    return true;
  }
  return false;
}

Assistant:

bool TGAImage::set(int x, int y, TGAColor &c) {
  if (!data || x < 0 || y < 0 || x >= width || y >= height) {
    return false;
  }
  memcpy(data + (x + y * width) * bytespp, c.bgra, bytespp);
  return true;
}